

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog.cc
# Opt level: O3

void __thiscall re2::Prog::Flatten(Prog *this)

{
  int iVar1;
  uint uVar2;
  _Tuple_impl<1UL,_re2::PODArray<unsigned_short>::Deleter> _Var3;
  Inst *pIVar4;
  unsigned_short *puVar5;
  ulong uVar6;
  long lVar7;
  Inst *__dest;
  unsigned_short *__s;
  int iVar8;
  _Head_base<0UL,_re2::SparseArray<int>::IndexValue_*,_false> _Var9;
  Prog *this_00;
  ulong uVar10;
  IndexValue *pIVar11;
  _Tuple_impl<1UL,_re2::PODArray<re2::Prog::Inst>::Deleter> _Var12;
  vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_> flat;
  vector<int,_std::allocator<int>_> flatmap;
  SparseArray<int> rootmap;
  vector<int,_std::allocator<int>_> stk;
  SparseArray<int> sorted;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  predvec;
  SparseSet reachable;
  SparseArray<int> predmap;
  new_allocator<re2::Prog::Inst> local_139;
  vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_> local_138;
  vector<int,_std::allocator<int>_> local_118;
  SparseArray<int> local_100;
  vector<int,_std::allocator<int>_> local_d8;
  SparseArray<int> local_c0;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_98;
  SparseSetT<void> local_80;
  SparseArray<int> local_58;
  
  if (this->did_flatten_ == false) {
    this->did_flatten_ = true;
    SparseSetT<void>::SparseSetT(&local_80,this->size_);
    local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)0x0;
    local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    std::vector<int,_std::allocator<int>_>::reserve(&local_d8,(long)this->size_);
    SparseArray<int>::SparseArray(&local_100,this->size_);
    SparseArray<int>::SparseArray(&local_58,this->size_);
    local_98.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_98.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_98.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    MarkSuccessors(this,&local_100,&local_58,&local_98,&local_80,&local_d8);
    SparseArray<int>::SparseArray(&local_c0,&local_100);
    _Var9._M_head_impl =
         local_c0.dense_.ptr_._M_t.
         super___uniq_ptr_impl<re2::SparseArray<int>::IndexValue,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter>
         ._M_t.
         super__Tuple_impl<0UL,_re2::SparseArray<int>::IndexValue_*,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter>
         .super__Head_base<0UL,_re2::SparseArray<int>::IndexValue_*,_false>._M_head_impl;
    uVar6 = (ulong)local_c0.size_;
    if (uVar6 == 0) {
      lVar7 = 0;
    }
    else {
      pIVar11 = local_c0.dense_.ptr_._M_t.
                super___uniq_ptr_impl<re2::SparseArray<int>::IndexValue,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter>
                ._M_t.
                super__Tuple_impl<0UL,_re2::SparseArray<int>::IndexValue_*,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter>
                .super__Head_base<0UL,_re2::SparseArray<int>::IndexValue_*,_false>._M_head_impl +
                uVar6;
      lVar7 = 0x3f;
      if (uVar6 != 0) {
        for (; uVar6 >> lVar7 == 0; lVar7 = lVar7 + -1) {
        }
      }
      std::
      __introsort_loop<re2::SparseArray<int>::IndexValue*,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(re2::SparseArray<int>::IndexValue_const&,re2::SparseArray<int>::IndexValue_const&)>>
                (local_c0.dense_.ptr_._M_t.
                 super___uniq_ptr_impl<re2::SparseArray<int>::IndexValue,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter>
                 ._M_t.
                 super__Tuple_impl<0UL,_re2::SparseArray<int>::IndexValue_*,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter>
                 .super__Head_base<0UL,_re2::SparseArray<int>::IndexValue_*,_false>._M_head_impl,
                 pIVar11,(ulong)(((uint)lVar7 ^ 0x3f) * 2) ^ 0x7e,
                 (_Iter_comp_iter<bool_(*)(const_re2::SparseArray<int>::IndexValue_&,_const_re2::SparseArray<int>::IndexValue_&)>
                  )0x1d5590);
      std::
      __final_insertion_sort<re2::SparseArray<int>::IndexValue*,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(re2::SparseArray<int>::IndexValue_const&,re2::SparseArray<int>::IndexValue_const&)>>
                (_Var9._M_head_impl,pIVar11,
                 (_Iter_comp_iter<bool_(*)(const_re2::SparseArray<int>::IndexValue_&,_const_re2::SparseArray<int>::IndexValue_&)>
                  )0x1d5590);
      lVar7 = (long)local_c0.size_;
    }
    pIVar11 = local_c0.dense_.ptr_._M_t.
              super___uniq_ptr_impl<re2::SparseArray<int>::IndexValue,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter>
              ._M_t.
              super__Tuple_impl<0UL,_re2::SparseArray<int>::IndexValue_*,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter>
              .super__Head_base<0UL,_re2::SparseArray<int>::IndexValue_*,_false>._M_head_impl +
              lVar7 + -1;
    if (pIVar11 !=
        local_c0.dense_.ptr_._M_t.
        super___uniq_ptr_impl<re2::SparseArray<int>::IndexValue,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter>
        ._M_t.
        super__Tuple_impl<0UL,_re2::SparseArray<int>::IndexValue_*,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter>
        .super__Head_base<0UL,_re2::SparseArray<int>::IndexValue_*,_false>._M_head_impl) {
      _Var9._M_head_impl =
           local_c0.dense_.ptr_._M_t.
           super___uniq_ptr_impl<re2::SparseArray<int>::IndexValue,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter>
           ._M_t.
           super__Tuple_impl<0UL,_re2::SparseArray<int>::IndexValue_*,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter>
           .super__Head_base<0UL,_re2::SparseArray<int>::IndexValue_*,_false>._M_head_impl;
      do {
        iVar1 = pIVar11->index_;
        if ((iVar1 != this->start_unanchored_) && (iVar1 != this->start_)) {
          MarkDominator(this,iVar1,&local_100,&local_58,&local_98,&local_80,&local_d8);
          _Var9._M_head_impl =
               local_c0.dense_.ptr_._M_t.
               super___uniq_ptr_impl<re2::SparseArray<int>::IndexValue,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter>
               ._M_t.
               super__Tuple_impl<0UL,_re2::SparseArray<int>::IndexValue_*,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter>
               .super__Head_base<0UL,_re2::SparseArray<int>::IndexValue_*,_false>._M_head_impl;
        }
        pIVar11 = pIVar11 + -1;
      } while (pIVar11 != _Var9._M_head_impl);
    }
    std::vector<int,_std::allocator<int>_>::vector
              (&local_118,(long)local_100.size_,(allocator_type *)&local_138);
    local_138.super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_138.super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_138.super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>::reserve
              (&local_138,(long)this->size_);
    if (local_100.size_ != 0) {
      _Var9._M_head_impl =
           local_100.dense_.ptr_._M_t.
           super___uniq_ptr_impl<re2::SparseArray<int>::IndexValue,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter>
           ._M_t.
           super__Tuple_impl<0UL,_re2::SparseArray<int>::IndexValue_*,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter>
           .super__Head_base<0UL,_re2::SparseArray<int>::IndexValue_*,_false>._M_head_impl;
      do {
        local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[(_Var9._M_head_impl)->value_] =
             (int)((ulong)((long)local_138.
                                 super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_138.
                                super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 3);
        this_00 = this;
        EmitList(this,(_Var9._M_head_impl)->index_,&local_100,&local_138,&local_80,&local_d8);
        local_138.super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>._M_impl.
        super__Vector_impl_data._M_finish[-1].out_opcode_ =
             local_138.super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>._M_impl
             .super__Vector_impl_data._M_finish[-1].out_opcode_ | 8;
        ComputeHints(this_00,&local_138,
                     local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[(_Var9._M_head_impl)->value_],
                     (int)((ulong)((long)local_138.
                                         super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_138.
                                        super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 3));
        _Var9._M_head_impl = _Var9._M_head_impl + 1;
      } while (_Var9._M_head_impl !=
               local_100.dense_.ptr_._M_t.
               super___uniq_ptr_impl<re2::SparseArray<int>::IndexValue,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter>
               ._M_t.
               super__Tuple_impl<0UL,_re2::SparseArray<int>::IndexValue_*,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter>
               .super__Head_base<0UL,_re2::SparseArray<int>::IndexValue_*,_false>._M_head_impl +
               local_100.size_);
    }
    this->list_count_ =
         (int)((ulong)((long)local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                      (long)local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start) >> 2);
    this->inst_count_[0] = 0;
    this->inst_count_[1] = 0;
    this->inst_count_[2] = 0;
    this->inst_count_[3] = 0;
    this->inst_count_[4] = 0;
    this->inst_count_[5] = 0;
    this->inst_count_[6] = 0;
    this->inst_count_[7] = 0;
    _Var12.super__Head_base<1UL,_re2::PODArray<re2::Prog::Inst>::Deleter,_false>._M_head_impl.len_ =
         SUB84((ulong)((long)local_138.
                             super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)local_138.
                            super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>.
                            _M_impl.super__Vector_impl_data._M_start) >> 3,0);
    if (0 < (int)_Var12.super__Head_base<1UL,_re2::PODArray<re2::Prog::Inst>::Deleter,_false>.
                 _M_head_impl.len_) {
      uVar6 = 0;
      do {
        uVar2 = local_138.super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>.
                _M_impl.super__Vector_impl_data._M_start[uVar6].out_opcode_;
        uVar10 = 1;
        if ((uVar2 & 7) != 1) {
          local_138.super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>._M_impl.
          super__Vector_impl_data._M_start[uVar6].out_opcode_ =
               uVar2 & 0xf |
               local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[uVar2 >> 4] << 4;
          uVar10 = (ulong)(uVar2 & 7);
        }
        this->inst_count_[uVar10] = this->inst_count_[uVar10] + 1;
        uVar6 = uVar6 + 1;
      } while (((uint)_Var12.super__Head_base<1UL,_re2::PODArray<re2::Prog::Inst>::Deleter,_false>.
                      _M_head_impl.len_ & 0x7fffffff) != uVar6);
    }
    iVar1 = this->start_unanchored_;
    if (iVar1 != 0) {
      iVar8 = local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[1];
      this->start_unanchored_ = iVar8;
      if (iVar1 != this->start_) {
        iVar8 = local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[2];
      }
      this->start_ = iVar8;
    }
    this->size_ = (int)_Var12.super__Head_base<1UL,_re2::PODArray<re2::Prog::Inst>::Deleter,_false>.
                       _M_head_impl.len_;
    __dest = __gnu_cxx::new_allocator<re2::Prog::Inst>::allocate
                       (&local_139,
                        (long)(int)_Var12.
                                   super__Head_base<1UL,_re2::PODArray<re2::Prog::Inst>::Deleter,_false>
                                   ._M_head_impl.len_,(void *)0x0);
    pIVar4 = (this->inst_).ptr_._M_t.
             super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>._M_t.
             super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>.
             super__Head_base<0UL,_re2::Prog::Inst_*,_false>._M_head_impl;
    (this->inst_).ptr_._M_t.
    super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>._M_t.
    super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>.
    super__Head_base<0UL,_re2::Prog::Inst_*,_false>._M_head_impl = __dest;
    if (pIVar4 != (Inst *)0x0) {
      operator_delete(pIVar4);
      __dest = (this->inst_).ptr_._M_t.
               super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>._M_t.
               super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>.
               super__Head_base<0UL,_re2::Prog::Inst_*,_false>._M_head_impl;
    }
    (this->inst_).ptr_._M_t.
    super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>._M_t.
    super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>.
    super__Tuple_impl<1UL,_re2::PODArray<re2::Prog::Inst>::Deleter>.
    super__Head_base<1UL,_re2::PODArray<re2::Prog::Inst>::Deleter,_false> =
         _Var12.super__Head_base<1UL,_re2::PODArray<re2::Prog::Inst>::Deleter,_false>._M_head_impl.
         len_;
    memmove(__dest,local_138.super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>.
                   _M_impl.super__Vector_impl_data._M_start,(long)this->size_ << 3);
    _Var3.super__Head_base<1UL,_re2::PODArray<unsigned_short>::Deleter,_false>._M_head_impl.len_ =
         (_Head_base<1UL,_re2::PODArray<unsigned_short>::Deleter,_false>)this->size_;
    if ((long)(int)_Var3.super__Head_base<1UL,_re2::PODArray<unsigned_short>::Deleter,_false>.
                   _M_head_impl.len_ < 0x201) {
      __s = __gnu_cxx::new_allocator<unsigned_short>::allocate
                      ((new_allocator<unsigned_short> *)&local_139,
                       (long)(int)_Var3.
                                  super__Head_base<1UL,_re2::PODArray<unsigned_short>::Deleter,_false>
                                  ._M_head_impl.len_,(void *)0x0);
      puVar5 = (this->list_heads_).ptr_._M_t.
               super___uniq_ptr_impl<unsigned_short,_re2::PODArray<unsigned_short>::Deleter>._M_t.
               super__Tuple_impl<0UL,_unsigned_short_*,_re2::PODArray<unsigned_short>::Deleter>.
               super__Head_base<0UL,_unsigned_short_*,_false>._M_head_impl;
      (this->list_heads_).ptr_._M_t.
      super___uniq_ptr_impl<unsigned_short,_re2::PODArray<unsigned_short>::Deleter>._M_t.
      super__Tuple_impl<0UL,_unsigned_short_*,_re2::PODArray<unsigned_short>::Deleter>.
      super__Head_base<0UL,_unsigned_short_*,_false>._M_head_impl = __s;
      if (puVar5 != (unsigned_short *)0x0) {
        operator_delete(puVar5);
        __s = (this->list_heads_).ptr_._M_t.
              super___uniq_ptr_impl<unsigned_short,_re2::PODArray<unsigned_short>::Deleter>._M_t.
              super__Tuple_impl<0UL,_unsigned_short_*,_re2::PODArray<unsigned_short>::Deleter>.
              super__Head_base<0UL,_unsigned_short_*,_false>._M_head_impl;
      }
      (this->list_heads_).ptr_._M_t.
      super___uniq_ptr_impl<unsigned_short,_re2::PODArray<unsigned_short>::Deleter>._M_t.
      super__Tuple_impl<0UL,_unsigned_short_*,_re2::PODArray<unsigned_short>::Deleter>.
      super__Tuple_impl<1UL,_re2::PODArray<unsigned_short>::Deleter>.
      super__Head_base<1UL,_re2::PODArray<unsigned_short>::Deleter,_false> =
           _Var3.super__Head_base<1UL,_re2::PODArray<unsigned_short>::Deleter,_false>._M_head_impl.
           len_;
      memset(__s,0xff,(long)this->size_ * 2);
      iVar1 = this->list_count_;
      if (0 < (long)iVar1) {
        puVar5 = (this->list_heads_).ptr_._M_t.
                 super___uniq_ptr_impl<unsigned_short,_re2::PODArray<unsigned_short>::Deleter>._M_t.
                 super__Tuple_impl<0UL,_unsigned_short_*,_re2::PODArray<unsigned_short>::Deleter>.
                 super__Head_base<0UL,_unsigned_short_*,_false>._M_head_impl;
        lVar7 = 0;
        do {
          puVar5[local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar7]] = (unsigned_short)lVar7;
          lVar7 = lVar7 + 1;
        } while (iVar1 != lVar7);
      }
    }
    if (local_138.super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_138.
                      super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    SparseArray<int>::~SparseArray(&local_c0);
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::~vector(&local_98);
    SparseArray<int>::~SparseArray(&local_58);
    SparseArray<int>::~SparseArray(&local_100);
    if (local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    SparseSetT<void>::~SparseSetT(&local_80);
  }
  return;
}

Assistant:

void Prog::Flatten() {
  if (did_flatten_)
    return;
  did_flatten_ = true;

  // Scratch structures. It's important that these are reused by functions
  // that we call in loops because they would thrash the heap otherwise.
  SparseSet reachable(size());
  std::vector<int> stk;
  stk.reserve(size());

  // First pass: Marks "successor roots" and predecessors.
  // Builds the mapping from inst-ids to root-ids.
  SparseArray<int> rootmap(size());
  SparseArray<int> predmap(size());
  std::vector<std::vector<int>> predvec;
  MarkSuccessors(&rootmap, &predmap, &predvec, &reachable, &stk);

  // Second pass: Marks "dominator roots".
  SparseArray<int> sorted(rootmap);
  std::sort(sorted.begin(), sorted.end(), sorted.less);
  for (SparseArray<int>::const_iterator i = sorted.end() - 1;
       i != sorted.begin();
       --i) {
    if (i->index() != start_unanchored() && i->index() != start())
      MarkDominator(i->index(), &rootmap, &predmap, &predvec, &reachable, &stk);
  }

  // Third pass: Emits "lists". Remaps outs to root-ids.
  // Builds the mapping from root-ids to flat-ids.
  std::vector<int> flatmap(rootmap.size());
  std::vector<Inst> flat;
  flat.reserve(size());
  for (SparseArray<int>::const_iterator i = rootmap.begin();
       i != rootmap.end();
       ++i) {
    flatmap[i->value()] = static_cast<int>(flat.size());
    EmitList(i->index(), &rootmap, &flat, &reachable, &stk);
    flat.back().set_last();
    // We have the bounds of the "list", so this is the
    // most convenient point at which to compute hints.
    ComputeHints(&flat, flatmap[i->value()], static_cast<int>(flat.size()));
  }

  list_count_ = static_cast<int>(flatmap.size());
  for (int i = 0; i < kNumInst; i++)
    inst_count_[i] = 0;

  // Fourth pass: Remaps outs to flat-ids.
  // Counts instructions by opcode.
  for (int id = 0; id < static_cast<int>(flat.size()); id++) {
    Inst* ip = &flat[id];
    if (ip->opcode() != kInstAltMatch)  // handled in EmitList()
      ip->set_out(flatmap[ip->out()]);
    inst_count_[ip->opcode()]++;
  }

  int total = 0;
  for (int i = 0; i < kNumInst; i++)
    total += inst_count_[i];
  DCHECK_EQ(total, static_cast<int>(flat.size()));

  // Remap start_unanchored and start.
  if (start_unanchored() == 0) {
    DCHECK_EQ(start(), 0);
  } else if (start_unanchored() == start()) {
    set_start_unanchored(flatmap[1]);
    set_start(flatmap[1]);
  } else {
    set_start_unanchored(flatmap[1]);
    set_start(flatmap[2]);
  }

  // Finally, replace the old instructions with the new instructions.
  size_ = static_cast<int>(flat.size());
  inst_ = PODArray<Inst>(size_);
  memmove(inst_.data(), flat.data(), size_*sizeof inst_[0]);

  // Populate the list heads for BitState.
  // 512 instructions limits the memory footprint to 1KiB.
  if (size_ <= 512) {
    list_heads_ = PODArray<uint16_t>(size_);
    // 0xFF makes it more obvious if we try to look up a non-head.
    memset(list_heads_.data(), 0xFF, size_*sizeof list_heads_[0]);
    for (int i = 0; i < list_count_; ++i)
      list_heads_[flatmap[i]] = i;
  }
}